

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

ostream * wasm::operator<<(ostream *os,HeapType type)

{
  ostream *poVar1;
  TypePrinter local_a0;
  ostream *local_18;
  ostream *os_local;
  HeapType type_local;
  
  local_18 = os;
  os_local = (ostream *)type.id;
  anon_unknown_0::TypePrinter::TypePrinter(&local_a0,os);
  poVar1 = anon_unknown_0::TypePrinter::print(&local_a0,(HeapType)os_local);
  anon_unknown_0::TypePrinter::~TypePrinter(&local_a0);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, HeapType type) {
  return TypePrinter(os).print(type);
}